

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.hpp
# Opt level: O0

void __thiscall
pstore::random_generator<unsigned_short>::random_generator(random_generator<unsigned_short> *this)

{
  result_type rVar1;
  random_generator<unsigned_short> *this_local;
  
  std::random_device::random_device(&this->device_);
  rVar1 = std::random_device::operator()(&this->device_);
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::mersenne_twister_engine(&this->generator_,(ulong)rVar1);
  std::uniform_int_distribution<unsigned_short>::uniform_int_distribution(&this->distribution_);
  return;
}

Assistant:

random_generator ()
                : generator_ (device_ ()) {}